

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall
cmCTestCVS::WriteXMLDirectory(cmCTestCVS *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  PathStatus status;
  string *psVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  Revision *rev;
  Revision *pRVar5;
  undefined1 local_140 [8];
  File f;
  undefined1 local_108 [8];
  string full;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>
  *fi;
  const_iterator __end1;
  const_iterator __begin1;
  Directory *__range1;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> revisions;
  string branchFlag;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *slash;
  Directory *dir_local;
  string *path_local;
  cmXMLWriter *xml_local;
  cmCTestCVS *this_local;
  
  slash = (char *)dir;
  dir_local = (Directory *)path;
  path_local = (string *)xml;
  xml_local = (cmXMLWriter *)this;
  cVar2 = std::__cxx11::string::empty();
  psVar1 = path_local;
  local_30 = "/";
  if (cVar2 != '\0') {
    local_30 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Directory",&local_51);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  psVar1 = path_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Name",(allocator<char> *)(branchFlag.field_2._M_local_buf + 0xf));
  cmXMLWriter::Element<std::__cxx11::string>
            ((cmXMLWriter *)psVar1,&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)(branchFlag.field_2._M_local_buf + 0xf));
  ComputeBranchFlag((string *)
                    &revisions.
                     super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,this,(string *)dir_local);
  std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::vector
            ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&__range1);
  pcVar4 = slash;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
                    *)slash);
  fi = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>_>
                 *)pcVar4);
  while( true ) {
    bVar3 = std::operator!=(&__end1,(_Self *)&fi);
    if (!bVar3) break;
    full.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>
         ::operator*(&__end1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f.PriorRev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local,
                   local_30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f.PriorRev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   full.field_2._8_8_);
    std::__cxx11::string::~string((string *)&f.PriorRev);
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::clear
              ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&__range1);
    if (*(int *)(full.field_2._8_8_ + 0x20) != 0) {
      std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
                ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&__range1,
                 &(this->super_cmCTestVC).Unknown);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    LoadRevisions(this,(string *)local_108,pcVar4,
                  (vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&__range1);
    std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::resize
              ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&__range1,2,
               &(this->super_cmCTestVC).Unknown);
    status = *(PathStatus *)(full.field_2._8_8_ + 0x20);
    rev = std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::data
                    ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&__range1)
    ;
    pRVar5 = std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::data
                       ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)
                        &__range1);
    cmCTestVC::File::File((File *)local_140,status,rev,pRVar5 + 1);
    cmCTestVC::WriteXMLEntry
              (&this->super_cmCTestVC,(cmXMLWriter *)path_local,(string *)dir_local,
               (string *)full.field_2._8_8_,(string *)local_108,(File *)local_140);
    std::__cxx11::string::~string((string *)local_108);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::PathStatus>_>
    ::operator++(&__end1);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)path_local);
  std::vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::~vector
            ((vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *)&__range1);
  std::__cxx11::string::~string
            ((string *)
             &revisions.
              super__Vector_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmCTestCVS::WriteXMLDirectory(cmXMLWriter& xml, std::string const& path,
                                   Directory const& dir)
{
  const char* slash = path.empty() ? "" : "/";
  xml.StartElement("Directory");
  xml.Element("Name", path);

  // Lookup the branch checked out in the working tree.
  std::string branchFlag = this->ComputeBranchFlag(path);

  // Load revisions and write an entry for each file in this directory.
  std::vector<Revision> revisions;
  for (auto const& fi : dir) {
    std::string full = path + slash + fi.first;

    // Load two real or unknown revisions.
    revisions.clear();
    if (fi.second != PathUpdated) {
      // For local modifications the current rev is unknown and the
      // prior rev is the latest from cvs.
      revisions.push_back(this->Unknown);
    }
    this->LoadRevisions(full, branchFlag.c_str(), revisions);
    revisions.resize(2, this->Unknown);

    // Write the entry for this file with these revisions.
    File f(fi.second, revisions.data(), revisions.data() + 1);
    this->WriteXMLEntry(xml, path, fi.first, full, f);
  }
  xml.EndElement(); // Directory
}